

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

bool __thiscall cmServer::Serve(cmServer *this,string *errorMessage)

{
  bool bVar1;
  
  if ((this->SupportedProtocols).
      super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->SupportedProtocols).
      super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::assign((char *)errorMessage);
    return false;
  }
  if (this->Protocol == (cmServerProtocol *)0x0) {
    bVar1 = cmServerBase::Serve(&this->super_cmServerBase,errorMessage);
    return bVar1;
  }
  __assert_fail("!this->Protocol",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0xec,"virtual bool cmServer::Serve(std::string *)");
}

Assistant:

bool cmServer::Serve(std::string* errorMessage)
{
  if (this->SupportedProtocols.empty()) {
    *errorMessage =
      "No protocol versions defined. Maybe you need --experimental?";
    return false;
  }
  assert(!this->Protocol);

  return cmServerBase::Serve(errorMessage);
}